

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

ostream * __thiscall smf::Options::printOptionListBooleanState(Options *this,ostream *out)

{
  iterator iVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  reference ppOVar5;
  void *this_00;
  _Self local_28;
  _Self local_20;
  iterator it;
  ostream *out_local;
  Options *this_local;
  
  it._M_node = (_Base_ptr)out;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::begin(&this->m_optionList);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->m_optionList);
    bVar2 = std::operator!=(&local_20,&local_28);
    iVar1 = it;
    if (!bVar2) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_20);
    poVar4 = std::operator<<((ostream *)iVar1._M_node,(string *)ppVar3);
    poVar4 = std::operator<<(poVar4,"\t");
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_20);
    ppOVar5 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(long)ppVar3->second);
    bVar2 = Option_register::isModified(*ppOVar5);
    this_00 = (void *)std::ostream::operator<<(poVar4,bVar2);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++(&local_20,0);
  }
  return (ostream *)it._M_node;
}

Assistant:

std::ostream& Options::printOptionListBooleanState(std::ostream& out) {
   for (auto it = m_optionList.begin(); it != m_optionList.end(); it++) {
      out << it->first << "\t"
          << m_optionRegister[it->second]->isModified() << std::endl;
   }
   return out;
}